

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O1

void __thiscall
TTD::SnapshotExtractor::BeginSnapshot
          (SnapshotExtractor *this,ThreadContext *threadContext,double gcTime)

{
  HeapAllocator *this_00;
  SnapShot *this_01;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  data._32_8_ = gcTime;
  if ((this->m_pendingSnap == (SnapShot *)0x0) &&
     ((this->m_worklist).list.super_DListBase<Js::RecyclableObject_*,_RealCount>.
      super_DListNodeBase<Js::RecyclableObject_*>.next.base ==
      (DListNodeBase<Js::RecyclableObject_*> *)&this->m_worklist)) {
    local_48 = (undefined1  [8])&SnapShot::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_437916b;
    data.filename._0_4_ = 0x15f;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_01 = (SnapShot *)Memory::HeapAllocator::AllocT<true>(this_00,0x1f8);
    SnapShot::SnapShot(this_01,(double)data._32_8_);
    this->m_pendingSnap = this_01;
    return;
  }
  TTDAbort_unrecoverable_error("Something went wrong.");
}

Assistant:

void SnapshotExtractor::BeginSnapshot(ThreadContext* threadContext, double gcTime)
    {
        TTDAssert((this->m_pendingSnap == nullptr) & this->m_worklist.Empty(), "Something went wrong.");

        this->m_pendingSnap = TT_HEAP_NEW(SnapShot, gcTime);
    }